

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::WBSetBitRange(LargeHeapBlock *this,char *addr,uint count)

{
  OutOfMemoryException *anon_var_0;
  uint i;
  AutoCriticalSection autoCs;
  AutoNestedHandledExceptionType local_24;
  uint local_20;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uint index;
  uint count_local;
  char *addr_local;
  LargeHeapBlock *this_local;
  
  index = (uint)addr;
  local_20 = index - *(int *)&(this->super_HeapBlock).address >> 3;
  __autoNestedHandledExceptionType.savedData.handledExceptionType = (Data)(Data)count;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_24,ExceptionType_DisableCheck);
  AutoCriticalSection::AutoCriticalSection
            ((AutoCriticalSection *)&stack0xffffffffffffffc0,&wbVerifyBitsLock);
  for (anon_var_0._4_4_ = ExceptionType_None;
      anon_var_0._4_4_ < (uint)__autoNestedHandledExceptionType.savedData.handledExceptionType;
      anon_var_0._4_4_ = anon_var_0._4_4_ + ExceptionType_OutOfMemory) {
    BVSparse<Memory::HeapAllocator>::Set(&this->wbVerifyBits,local_20 + anon_var_0._4_4_);
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&stack0xffffffffffffffc0);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_24);
  return;
}

Assistant:

void LargeHeapBlock::WBSetBitRange(char* addr, uint count)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    try
    {
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(static_cast<ExceptionType>(ExceptionType_DisableCheck));
        AutoCriticalSection autoCs(&wbVerifyBitsLock);
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.Set(index + i);
        }
    }
    catch (Js::OutOfMemoryException&)
    {
    }
}